

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintsGroup.cpp
# Opt level: O3

vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_> *
__thiscall iDynTree::optimalcontrol::ConstraintsGroup::getTimeRanges(ConstraintsGroup *this)

{
  undefined8 *puVar1;
  _Hash_node_base *p_Var2;
  pointer pTVar3;
  _Hash_node_base *p_Var4;
  long lVar5;
  ConstraintsGroupPimpl *pCVar6;
  _Hash_node_base *p_Var7;
  ulong __new_size;
  
  pCVar6 = this->m_pimpl;
  __new_size = (ulong)(uint)(pCVar6->group)._M_h._M_element_count;
  if (((long)(pCVar6->timeRanges).
             super__Vector_base<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(pCVar6->timeRanges).
             super__Vector_base<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - __new_size != 0
     ) {
    std::
    vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
    ::resize(&pCVar6->timeRanges,__new_size);
    pCVar6 = this->m_pimpl;
  }
  p_Var7 = (pCVar6->group)._M_h._M_before_begin._M_nxt;
  if (p_Var7 != (_Hash_node_base *)0x0) {
    lVar5 = 0;
    do {
      p_Var2 = p_Var7[5]._M_nxt;
      pTVar3 = (this->m_pimpl->timeRanges).
               super__Vector_base<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (&pTVar3->m_anyTime)[lVar5] = *(bool *)&p_Var2[4]._M_nxt;
      p_Var4 = p_Var2[3]._M_nxt;
      puVar1 = (undefined8 *)((long)&pTVar3->m_initTime + lVar5);
      *puVar1 = p_Var2[2]._M_nxt;
      puVar1[1] = p_Var4;
      p_Var7 = p_Var7->_M_nxt;
      lVar5 = lVar5 + 0x18;
    } while (p_Var7 != (_Hash_node_base *)0x0);
    pCVar6 = this->m_pimpl;
  }
  return &pCVar6->timeRanges;
}

Assistant:

std::vector<TimeRange>& ConstraintsGroup::getTimeRanges()
        {
            if (m_pimpl->timeRanges.size() != numberOfConstraints()) {
                m_pimpl->timeRanges.resize(numberOfConstraints());
            }

            size_t i=0;
            for (auto& constraint : m_pimpl->group) {
                m_pimpl->timeRanges[i] = constraint.second->timeRange;
                ++i;
            }
            return m_pimpl->timeRanges;
        }